

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock-allocator.h
# Opt level: O0

void __thiscall MockAllocator::MockAllocator(MockAllocator *this)

{
  FunctionMocker<void_(void_*,_unsigned_long)> *in_RDI;
  
  testing::internal::FunctionMocker<void_*(unsigned_long)>::FunctionMocker
            ((FunctionMocker<void_*(unsigned_long)> *)in_RDI);
  testing::internal::FunctionMocker<void_(void_*,_unsigned_long)>::FunctionMocker(in_RDI);
  return;
}

Assistant:

MockAllocator() {}